

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleTest(cmSetPropertyCommand *this,cmTest *test)

{
  char *value;
  
  if (this->Remove == false) {
    value = (this->PropertyValue)._M_dataplus._M_p;
  }
  else {
    value = (char *)0x0;
  }
  if (this->AppendMode == true) {
    cmTest::AppendProperty(test,&this->PropertyName,value,this->AppendAsString);
  }
  else {
    cmTest::SetProperty(test,&this->PropertyName,value);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTest(cmTest* test)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }
  if (this->AppendMode) {
    test->AppendProperty(name, value, this->AppendAsString);
  } else {
    test->SetProperty(name, value);
  }

  return true;
}